

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O0

bool __thiscall ON_Linetype::SetTaper(ON_Linetype *this,double startWidth,double endWidth)

{
  ON_LinetypePrivate *pOVar1;
  ON_2dPoint local_48;
  ON_2dPoint local_38;
  double local_28;
  double endWidth_local;
  double startWidth_local;
  ON_Linetype *this_local;
  
  if ((startWidth < 0.0) || (endWidth < 0.0)) {
    this_local._7_1_ = false;
  }
  else {
    local_28 = endWidth;
    endWidth_local = startWidth;
    startWidth_local = (double)this;
    ON_SimpleArray<ON_2dPoint>::Empty(&this->m_private->m_taper_points);
    pOVar1 = this->m_private;
    ON_2dPoint::ON_2dPoint(&local_38,0.0,endWidth_local);
    ON_SimpleArray<ON_2dPoint>::Append(&pOVar1->m_taper_points,&local_38);
    pOVar1 = this->m_private;
    ON_2dPoint::ON_2dPoint(&local_48,1.0,local_28);
    ON_SimpleArray<ON_2dPoint>::Append(&pOVar1->m_taper_points,&local_48);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Linetype::SetTaper(double startWidth, double endWidth)
{
  if (startWidth < 0 || endWidth < 0)
    return false;

  m_private->m_taper_points.Empty();
  m_private->m_taper_points.Append(ON_2dPoint(0, startWidth));
  m_private->m_taper_points.Append(ON_2dPoint(1.0, endWidth));
  return true;
}